

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::expand(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Entry *pEVar5;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> **key;
  Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *in_RDI;
  int remaining;
  Entry *current;
  void *mem;
  Entry *oldEntries;
  size_t oldCapacity;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Entry *local_28;
  Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *this_00;
  
  key = (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(long)in_RDI->_capacity;
  if (in_RDI->_capacity == 0) {
    iVar2 = 0x20;
  }
  else {
    iVar2 = in_RDI->_capacity << 1;
  }
  in_RDI->_capacity = iVar2;
  local_28 = in_RDI->_entries;
  this_00 = in_RDI;
  pvVar4 = Lib::alloc(CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  pEVar5 = array_new<Lib::Map<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const*,Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::DerefPtrHash<Lib::StlHash>>::Entry>
                     ((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (size_t)in_RDI);
  in_RDI->_entries = pEVar5;
  in_RDI->_afterLast = in_RDI->_entries + in_RDI->_capacity;
  in_RDI->_maxEntries = (int)((double)in_RDI->_capacity * 0.8);
  iVar3 = in_RDI->_noOfEntries;
  in_RDI->_noOfEntries = 0;
  pEVar5 = local_28;
  for (; iVar3 != 0; iVar3 = iVar3 + -1) {
    while (bVar1 = Entry::occupied(local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffffb8 = Entry::key(local_28);
    Entry::value(local_28);
    insert(this_00,key,
           (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
            *)pEVar5,(uint)((ulong)pvVar4 >> 0x20));
    local_28 = local_28 + 1;
  }
  if (pEVar5 != (Entry *)0x0) {
    array_delete<Lib::Map<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const*,Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::DerefPtrHash<Lib::StlHash>>::Entry>
              ((Entry *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(size_t)in_stack_ffffffffffffffb8)
    ;
    Lib::free(pEVar5);
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }